

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCreateTable(Btree *p,int *piTable,int flags)

{
  int *piVar1;
  BtShared *pBt;
  uint uVar2;
  uint uVar3;
  BtCursor *pBVar4;
  int iVar5;
  DbPage *pPg;
  uint nearby;
  MemPage *pMVar6;
  u8 eType;
  MemPage *pRoot;
  Pgno pgnoMove;
  MemPage *pPageMove;
  u8 local_5d;
  int local_5c;
  MemPage *local_58;
  uint local_4c;
  Pgno local_48;
  Pgno local_44;
  MemPage *local_40;
  uint *local_38;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBt = p->pBt;
  if (pBt->autoVacuum == '\0') {
    iVar5 = allocateBtreePage(pBt,&local_58,&local_4c,1,'\0');
    pMVar6 = local_58;
    local_5c = iVar5;
    if (iVar5 != 0) goto LAB_0014a4b9;
LAB_0014a437:
    zeroPage(pMVar6,(flags & 1U) * 3 + 10);
    if (pMVar6->pDbPage != (DbPage *)0x0) {
      sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
    }
    *piTable = local_4c;
    iVar5 = 0;
    goto LAB_0014a4b9;
  }
  for (pBVar4 = pBt->pCursor; pBVar4 != (BtCursor *)0x0; pBVar4 = pBVar4->pNext) {
    pBVar4->curFlags = pBVar4->curFlags & 0xfb;
  }
  local_38 = (uint *)piTable;
  sqlite3BtreeGetMeta(p,4,&local_4c);
  do {
    uVar2 = local_4c;
    nearby = uVar2 + 1;
    uVar3 = 0;
    if (1 < nearby) {
      iVar5 = (uVar2 - 1) - (uVar2 - 1) % (pBt->usableSize / 5 + 1);
      uVar3 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
    }
    local_4c = nearby;
  } while ((nearby == uVar3) || (uVar2 == (uint)sqlite3PendingByte / pBt->pageSize));
  local_5c = allocateBtreePage(pBt,&local_40,&local_44,nearby,'\x01');
  iVar5 = local_5c;
  if (local_5c != 0) goto LAB_0014a4b9;
  if (local_44 == nearby) {
    local_58 = local_40;
    pMVar6 = local_40;
LAB_0014a3b4:
    ptrmapPut(pBt,nearby,'\x01',0,&local_5c);
    if ((local_5c == 0) &&
       (local_5c = sqlite3BtreeUpdateMeta(p,4,nearby), piTable = (int *)local_38, local_5c == 0))
    goto LAB_0014a437;
    iVar5 = local_5c;
    if (pMVar6 == (MemPage *)0x0) goto LAB_0014a4b9;
    pPg = pMVar6->pDbPage;
  }
  else {
    local_5d = '\0';
    local_48 = 0;
    if (pBt->pCursor == (BtCursor *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
    }
    if (local_40 != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_40->pDbPage);
    }
    if ((iVar5 != 0) || (iVar5 = btreeGetPage(pBt,nearby,&local_58,0), iVar5 != 0))
    goto LAB_0014a4b9;
    iVar5 = ptrmapGet(pBt,nearby,&local_5d,&local_48);
    pMVar6 = local_58;
    if ((byte)(local_5d - 1) < 2) {
      iVar5 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11a3e,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
LAB_0014a53e:
      pMVar6 = local_58;
      if (local_58 == (MemPage *)0x0) goto LAB_0014a4b9;
    }
    else {
      if (iVar5 != 0) goto LAB_0014a53e;
      iVar5 = relocatePage(pBt,local_58,local_5d,local_48,local_44,0);
      if (pMVar6 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
      }
      if ((iVar5 != 0) ||
         (iVar5 = btreeGetPage(pBt,nearby,&local_58,0), pMVar6 = local_58, iVar5 != 0))
      goto LAB_0014a4b9;
      iVar5 = sqlite3PagerWrite(local_58->pDbPage);
      local_5c = iVar5;
      if (iVar5 == 0) goto LAB_0014a3b4;
    }
    pPg = pMVar6->pDbPage;
  }
  sqlite3PagerUnrefNotNull(pPg);
LAB_0014a4b9:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, int *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}